

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_quit(Curl_easy *data,connectdata *conn)

{
  CURLcode error;
  char *pcVar1;
  CURLcode local_24;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  local_24 = CURLE_OK;
  if ((*(byte *)((long)&conn->proto + 0x11a) >> 2 & 1) != 0) {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       (0 < Curl_trc_feat_ftp.log_level)) {
      Curl_trc_ftp(data,"sending QUIT to close session");
    }
    error = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"%s","QUIT");
    if (error != CURLE_OK) {
      pcVar1 = curl_easy_strerror(error);
      Curl_failf(data,"Failure sending QUIT command: %s",pcVar1);
      *(byte *)((long)&conn->proto + 0x11a) = *(byte *)((long)&conn->proto + 0x11a) & 0xfb;
      Curl_conncontrol(conn,1);
      _ftp_state(data,'\0');
      return error;
    }
    _ftp_state(data,'\"');
    local_24 = ftp_block_statemach(data,conn);
  }
  return local_24;
}

Assistant:

static CURLcode ftp_quit(struct Curl_easy *data, struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  if(conn->proto.ftpc.ctl_valid) {
    CURL_TRC_FTP(data, "sending QUIT to close session");
    result = Curl_pp_sendf(data, &conn->proto.ftpc.pp, "%s", "QUIT");
    if(result) {
      failf(data, "Failure sending QUIT command: %s",
            curl_easy_strerror(result));
      conn->proto.ftpc.ctl_valid = FALSE; /* mark control connection as bad */
      connclose(conn, "QUIT command failed"); /* mark for connection closure */
      ftp_state(data, FTP_STOP);
      return result;
    }

    ftp_state(data, FTP_QUIT);

    result = ftp_block_statemach(data, conn);
  }

  return result;
}